

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

int GetSkipHeight(int height)

{
  long lVar1;
  uint in_EDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffec;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)in_EDI < 2) {
    local_c = 0;
  }
  else if ((in_EDI & 1) == 0) {
    local_c = InvertLowestOne(in_stack_ffffffffffffffec);
  }
  else {
    InvertLowestOne(in_stack_ffffffffffffffec);
    local_c = InvertLowestOne(in_stack_ffffffffffffffec);
    local_c = local_c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

int static inline GetSkipHeight(int height) {
    if (height < 2)
        return 0;

    // Determine which height to jump back to. Any number strictly lower than height is acceptable,
    // but the following expression seems to perform well in simulations (max 110 steps to go back
    // up to 2**18 blocks).
    return (height & 1) ? InvertLowestOne(InvertLowestOne(height - 1)) + 1 : InvertLowestOne(height);
}